

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherLinux.cpp
# Opt level: O0

void __thiscall FW::FileWatcherLinux::removeWatch(FileWatcherLinux *this,WatchID watchid)

{
  WatchStruct *this_00;
  bool bVar1;
  pointer ppVar2;
  WatchStruct *watch;
  _Self local_20;
  iterator iter;
  WatchID watchid_local;
  FileWatcherLinux *this_local;
  
  iter._M_node = (_Base_ptr)watchid;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_FW::WatchStruct_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
       ::find(&this->mWatches,(key_type *)&iter);
  watch = (WatchStruct *)
          std::
          map<unsigned_long,_FW::WatchStruct_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>_>
          ::end(&this->mWatches);
  bVar1 = std::operator==(&local_20,(_Self *)&watch);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_FW::WatchStruct_*>_>::operator->
                       (&local_20);
    this_00 = ppVar2->second;
    std::
    map<unsigned_long,FW::WatchStruct*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
    ::erase_abi_cxx11_((map<unsigned_long,FW::WatchStruct*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,FW::WatchStruct*>>>
                        *)&this->mWatches,(iterator)local_20._M_node);
    inotify_rm_watch(this->mFD,(int)iter._M_node);
    if (this_00 != (WatchStruct *)0x0) {
      WatchStruct::~WatchStruct(this_00);
      operator_delete(this_00,0x38);
    }
  }
  return;
}

Assistant:

void FileWatcherLinux::removeWatch(WatchID watchid)
	{
		WatchMap::iterator iter = mWatches.find(watchid);

		if(iter == mWatches.end())
			return;

		WatchStruct* watch = iter->second;
		mWatches.erase(iter);
	
		inotify_rm_watch(mFD, watchid);
		
		delete watch;
		watch = 0;
	}